

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O0

void nn_mutex_init(nn_mutex_t *self)

{
  FILE *pFVar1;
  char *pcVar2;
  pthread_mutex_t *in_RDI;
  pthread_mutexattr_t attr;
  int rc;
  int in_stack_ffffffffffffffdc;
  pthread_mutexattr_t local_10;
  uint local_c;
  pthread_mutex_t *local_8;
  
  local_8 = in_RDI;
  pthread_mutexattr_init(&local_10);
  local_c = pthread_mutexattr_settype(&local_10,2);
  if (local_c != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    pcVar2 = nn_err_strerror(in_stack_ffffffffffffffdc);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)local_c,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/mutex.c"
            ,0x46);
    fflush(_stderr);
    nn_err_abort();
  }
  local_c = pthread_mutex_init(local_8,(pthread_mutexattr_t *)0x0);
  if (local_c != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    pcVar2 = nn_err_strerror(in_stack_ffffffffffffffdc);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)local_c,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/mutex.c"
            ,0x48);
    fflush(_stderr);
    nn_err_abort();
  }
  pthread_mutexattr_destroy(&local_10);
  return;
}

Assistant:

void nn_mutex_init (nn_mutex_t *self)
{
    int rc;
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    rc = pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    pthread_mutexattr_destroy(&attr);
}